

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priorbox.cpp
# Opt level: O2

int __thiscall
ncnn::PriorBox::forward
          (PriorBox *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  pointer pMVar5;
  Mat *pMVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  undefined1 (*pauVar15) [16];
  ulong uVar16;
  uint uVar17;
  float *pfVar18;
  ulong uVar19;
  int iVar20;
  int j;
  uint uVar21;
  int p;
  ulong uVar22;
  long lVar23;
  int iVar24;
  int p_1;
  uint uVar25;
  uint uVar26;
  undefined1 auVar27 [12];
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar31 [12];
  float fVar32;
  uint uVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  undefined1 auVar40 [16];
  float fVar41;
  undefined1 in_XMM15 [16];
  undefined1 auVar42 [16];
  float local_98;
  
  pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = pMVar5->w;
  uVar3 = pMVar5->h;
  uVar16 = (ulong)uVar3;
  iVar14 = this->image_width;
  iVar24 = this->image_height;
  if ((iVar24 == -0xe9 && iVar14 == -0xe9) &&
      (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pMVar5 == 0x40) {
    if (((this->max_sizes).data == (void *)0x0) ||
       ((long)(this->max_sizes).c * (this->max_sizes).cstep == 0)) {
      fVar30 = this->step_width;
      fVar1 = this->step_height;
      uVar17 = (this->min_sizes).w;
      iVar14 = (this->aspect_ratios).w;
      iVar24 = uVar17 + iVar14 + -1;
      pMVar6 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar6,uVar2 * uVar3 * iVar24 * 4,4,opt->blob_allocator);
      pvVar7 = pMVar6->data;
      if (pvVar7 == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar6->c * pMVar6->cstep == 0) {
        return -100;
      }
      fVar28 = 1.0 / (float)(int)uVar2;
      uVar25 = -(uint)(fVar30 == -233.0);
      fVar30 = (float)(~uVar25 & (uint)fVar30 | uVar25 & (uint)fVar28);
      uVar25 = -(uint)(fVar1 == -233.0);
      fVar32 = (float)(int)uVar3 * 0.5;
      uVar13 = 0;
      uVar19 = (ulong)uVar17;
      if ((int)uVar17 < 1) {
        uVar19 = uVar13;
      }
      uVar17 = uVar2;
      if ((int)uVar2 < 1) {
        uVar17 = 0;
      }
      if ((int)uVar3 < 1) {
        uVar16 = uVar13;
      }
      for (; uVar13 != uVar16; uVar13 = uVar13 + 1) {
        pauVar15 = (undefined1 (*) [16])
                   ((long)pvVar7 + (long)(int)(iVar24 * uVar2 * 4 * (int)uVar13) * 4);
        fVar35 = this->offset * fVar30;
        fVar34 = ((float)(int)uVar13 + this->offset) *
                 (float)(~uVar25 & (uint)fVar1 | (uint)(1.0 / (float)(int)uVar3) & uVar25);
        pfVar18 = (float *)(this->min_sizes).data;
        for (uVar21 = 0; uVar21 != uVar17; uVar21 = uVar21 + 1) {
          pvVar8 = (this->min_sizes).data;
          for (uVar22 = 0; uVar19 != uVar22; uVar22 = uVar22 + 1) {
            fVar37 = *(float *)((long)pvVar8 + uVar22 * 4);
            fVar38 = fVar32 * fVar37 * fVar28;
            fVar37 = fVar37 * 0.5;
            in_XMM15._4_4_ = fVar34 - fVar37;
            in_XMM15._0_4_ = fVar35 - fVar38;
            in_XMM15._8_4_ = fVar35 + fVar38;
            in_XMM15._12_4_ = fVar34 + fVar37;
            *pauVar15 = in_XMM15;
            pauVar15 = pauVar15 + 1;
          }
          fVar37 = *pfVar18;
          pvVar8 = (this->aspect_ratios).data;
          for (lVar23 = 1; lVar23 < iVar14; lVar23 = lVar23 + 1) {
            fVar38 = *(float *)((long)pvVar8 + lVar23 * 4);
            auVar42 = rsqrtss(in_XMM15,ZEXT416((uint)fVar38));
            fVar36 = auVar42._0_4_;
            fVar29 = fVar38 * fVar36 * fVar36 + -3.0;
            fVar38 = (float)(~-(uint)(ABS(fVar38) < 1.1754944e-38) &
                            (uint)(fVar38 * fVar36 * -0.5 * fVar29)) * fVar32 * fVar37 * fVar28;
            fVar29 = fVar36 * -0.5 * fVar37 * 0.5 * fVar29;
            in_XMM15._4_4_ = fVar29;
            in_XMM15._0_4_ = fVar38;
            in_XMM15._8_4_ = fVar35;
            in_XMM15._12_4_ = fVar34;
            *(float *)*pauVar15 = fVar35 - fVar38;
            *(float *)((long)*pauVar15 + 4) = fVar34 - fVar29;
            *(float *)((long)*pauVar15 + 8) = fVar35 + fVar38;
            *(float *)((long)*pauVar15 + 0xc) = fVar34 + fVar29;
            pauVar15 = pauVar15 + 1;
          }
          fVar35 = fVar35 + fVar30;
        }
      }
      if (this->clip != 0) {
        uVar16 = (ulong)(uint)pMVar6->w;
        if (pMVar6->w < 1) {
          uVar16 = 0;
        }
        for (uVar19 = 0; uVar16 != uVar19; uVar19 = uVar19 + 1) {
          fVar30 = *(float *)((long)pvVar7 + uVar19 * 4);
          auVar27._4_8_ = 0;
          auVar27._0_4_ = fVar30;
          if (fVar30 <= 0.0) {
            auVar27 = ZEXT812(0) << 0x20;
          }
          if (1.0 <= auVar27._0_4_) {
            auVar27._4_8_ = auVar27._4_8_;
            auVar27._0_4_ = 0x3f800000;
          }
          *(int *)((long)pvVar7 + uVar19 * 4) = auVar27._0_4_;
        }
        return 0;
      }
      return 0;
    }
  }
  else if (iVar14 != -0xe9) goto LAB_00141e2c;
  iVar14 = pMVar5[1].w;
LAB_00141e2c:
  if (iVar24 == -0xe9) {
    iVar24 = pMVar5[1].h;
  }
  fVar30 = this->step_width;
  fVar1 = this->step_height;
  uVar17 = (this->min_sizes).w;
  iVar4 = (this->max_sizes).w;
  uVar25 = (this->aspect_ratios).w;
  iVar20 = this->flip;
  if (this->flip != 0) {
    iVar20 = uVar25 * uVar17;
  }
  iVar20 = uVar25 * uVar17 + iVar4 + uVar17 + iVar20;
  pMVar6 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Mat::create(pMVar6,uVar2 * uVar3 * iVar20 * 4,2,4,opt->blob_allocator);
  pvVar7 = pMVar6->data;
  iVar12 = -100;
  if ((pvVar7 != (void *)0x0) && ((long)pMVar6->c * pMVar6->cstep != 0)) {
    fVar28 = (float)iVar14;
    fVar32 = (float)iVar24;
    auVar42._8_8_ = CONCAT44(fVar32,fVar28);
    auVar42._0_8_ = CONCAT44(fVar32,fVar28);
    uVar21 = -(uint)(fVar30 == -233.0);
    uVar33 = (uint)(fVar28 / (float)(int)uVar2) & uVar21;
    local_98 = (float)(~uVar21 & (uint)fVar30 | uVar33);
    uVar21 = 0;
    uVar19 = 0;
    if ((int)uVar25 < 1) {
      uVar25 = uVar21;
    }
    uVar26 = -(uint)(fVar1 == -233.0);
    if ((int)uVar17 < 1) {
      uVar17 = uVar21;
    }
    uVar11 = uVar2;
    if ((int)uVar2 < 1) {
      uVar11 = uVar21;
    }
    if ((int)uVar3 < 1) {
      uVar16 = 0;
    }
    auVar42 = rcpps(ZEXT416(uVar33),auVar42);
    fVar30 = auVar42._0_4_;
    fVar34 = auVar42._4_4_;
    fVar35 = auVar42._8_4_;
    fVar37 = auVar42._12_4_;
    fVar30 = (1.0 - fVar28 * fVar30) * fVar30 + fVar30;
    fVar34 = (1.0 - fVar32 * fVar34) * fVar34 + fVar34;
    fVar35 = (1.0 - fVar28 * fVar35) * fVar35 + fVar35;
    fVar37 = (1.0 - fVar32 * fVar37) * fVar37 + fVar37;
    for (; uVar19 != uVar16; uVar19 = uVar19 + 1) {
      pauVar15 = (undefined1 (*) [16])
                 ((long)pvVar7 + (long)(int)(iVar20 * uVar2 * 4 * (int)uVar19) * 4);
      fVar38 = this->offset * local_98;
      fVar28 = ((float)(int)uVar19 + this->offset) *
               (float)(~uVar26 & (uint)fVar1 | (uint)(fVar32 / (float)(int)uVar3) & uVar26);
      for (uVar21 = 0; uVar21 != uVar11; uVar21 = uVar21 + 1) {
        pvVar8 = (this->min_sizes).data;
        pvVar9 = (this->max_sizes).data;
        for (uVar13 = 0; uVar13 != uVar17; uVar13 = uVar13 + 1) {
          fVar29 = *(float *)((long)pvVar8 + uVar13 * 4);
          fVar36 = fVar29 * 0.5;
          auVar40._0_4_ = (fVar38 - fVar36) * fVar30;
          auVar40._4_4_ = (fVar28 - fVar36) * fVar34;
          auVar40._8_4_ = (fVar36 + fVar38) * fVar35;
          auVar40._12_4_ = (fVar36 + fVar28) * fVar37;
          *pauVar15 = auVar40;
          if (iVar4 < 1) {
            pauVar15 = pauVar15 + 1;
          }
          else {
            fVar29 = SQRT(fVar29 * *(float *)((long)pvVar9 + uVar13 * 4)) * 0.5;
            auVar40._0_4_ = fVar38 - fVar29;
            auVar40._4_4_ = fVar28 - fVar29;
            auVar40._8_4_ = fVar38 - fVar29;
            auVar40._12_4_ = fVar28 - fVar29;
            *(float *)pauVar15[1] = auVar40._0_4_ * fVar30;
            *(float *)(pauVar15[1] + 4) = auVar40._4_4_ * fVar34;
            *(float *)(pauVar15[1] + 8) = (fVar29 + fVar38) * fVar35;
            *(float *)(pauVar15[1] + 0xc) = (fVar29 + fVar28) * fVar37;
            pauVar15 = pauVar15 + 2;
          }
          pvVar10 = (this->aspect_ratios).data;
          iVar14 = this->flip;
          for (uVar22 = 0; uVar25 != uVar22; uVar22 = uVar22 + 1) {
            fVar29 = *(float *)((long)pvVar10 + uVar22 * 4);
            auVar42 = rsqrtss(auVar40,ZEXT416((uint)fVar29));
            fVar39 = auVar42._0_4_;
            fVar41 = fVar29 * fVar39 * fVar39 + -3.0;
            auVar40._4_12_ = auVar42._4_12_;
            fVar29 = (float)(~-(uint)(ABS(fVar29) < 1.1754944e-38) &
                            (uint)(fVar29 * fVar39 * -0.5 * fVar41)) * fVar36;
            auVar40._0_4_ = fVar39 * -0.5 * fVar36 * fVar41;
            *(float *)*pauVar15 = (fVar38 - fVar29) * fVar30;
            *(float *)((long)*pauVar15 + 4) = (fVar28 - auVar40._0_4_) * fVar34;
            *(float *)((long)*pauVar15 + 8) = (fVar38 + fVar29) * fVar35;
            *(float *)((long)*pauVar15 + 0xc) = (fVar28 + auVar40._0_4_) * fVar37;
            if (iVar14 == 0) {
              pauVar15 = pauVar15 + 1;
            }
            else {
              *(float *)pauVar15[1] = (fVar38 - auVar40._0_4_) * fVar30;
              *(float *)(pauVar15[1] + 4) = (fVar28 - fVar29) * fVar34;
              *(float *)(pauVar15[1] + 8) = (fVar38 + auVar40._0_4_) * fVar35;
              *(float *)(pauVar15[1] + 0xc) = (fVar28 + fVar29) * fVar37;
              pauVar15 = pauVar15 + 2;
            }
          }
        }
        fVar38 = fVar38 + local_98;
      }
    }
    uVar2 = pMVar6->w;
    if (this->clip != 0) {
      uVar16 = 0;
      uVar19 = 0;
      if (0 < (int)uVar2) {
        uVar19 = (ulong)uVar2;
      }
      for (; uVar19 != uVar16; uVar16 = uVar16 + 1) {
        fVar30 = *(float *)((long)pvVar7 + uVar16 * 4);
        auVar31._4_8_ = 0;
        auVar31._0_4_ = fVar30;
        if (fVar30 <= 0.0) {
          auVar31 = ZEXT812(0) << 0x20;
        }
        if (1.0 <= auVar31._0_4_) {
          auVar31._4_8_ = auVar31._4_8_;
          auVar31._0_4_ = 0x3f800000;
        }
        *(int *)((long)pvVar7 + uVar16 * 4) = auVar31._0_4_;
      }
    }
    pfVar18 = (float *)((long)pvVar7 + (long)(int)uVar2 * pMVar6->elemsize);
    uVar16 = (long)(int)uVar2 / 4 & 0xffffffff;
    iVar12 = 0;
    if ((int)((long)(int)uVar2 / 4) < 1) {
      uVar16 = 0;
    }
    while (iVar14 = (int)uVar16, uVar16 = (ulong)(iVar14 - 1), iVar14 != 0) {
      *pfVar18 = this->variances[0];
      pfVar18[1] = this->variances[1];
      pfVar18[2] = this->variances[2];
      pfVar18[3] = this->variances[3];
      pfVar18 = pfVar18 + 4;
    }
  }
  return iVar12;
}

Assistant:

int PriorBox::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int w = bottom_blobs[0].w;
    int h = bottom_blobs[0].h;

    if (bottom_blobs.size() == 1 && image_width == -233 && image_height == -233 && max_sizes.empty())
    {
        // mxnet style _contrib_MultiBoxPrior
        float step_w = step_width;
        float step_h = step_height;
        if (step_w == -233)
            step_w = 1.f / (float)w;
        if (step_h == -233)
            step_h = 1.f / (float)h;

        int num_sizes = min_sizes.w;
        int num_ratios = aspect_ratios.w;

        int num_prior = num_sizes - 1 + num_ratios;

        Mat& top_blob = top_blobs[0];
        top_blob.create(4 * w * h * num_prior, 4u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* box = (float*)top_blob + i * w * num_prior * 4;

            float center_x = offset * step_w;
            float center_y = offset * step_h + i * step_h;

            for (int j = 0; j < w; j++)
            {
                // ratio = 1, various sizes
                for (int k = 0; k < num_sizes; k++)
                {
                    float size = min_sizes[k];
                    float cw = size * h / w / 2;
                    float ch = size / 2;

                    box[0] = center_x - cw;
                    box[1] = center_y - ch;
                    box[2] = center_x + cw;
                    box[3] = center_y + ch;
                    box += 4;
                }

                // various ratios, size = min_size = size[0]
                float size = min_sizes[0];
                for (int p = 1; p < num_ratios; p++)
                {
                    float ratio = sqrt(aspect_ratios[p]);
                    float cw = size * h / w * ratio / 2;
                    float ch = size / ratio / 2;

                    box[0] = center_x - cw;
                    box[1] = center_y - ch;
                    box[2] = center_x + cw;
                    box[3] = center_y + ch;
                    box += 4;
                }

                center_x += step_w;
            }
        }

        if (clip)
        {
            float* box = top_blob;
            for (int i = 0; i < top_blob.w; i++)
            {
                box[i] = std::min(std::max(box[i], 0.f), 1.f);
            }
        }

        return 0;
    }

    int image_w = image_width;
    int image_h = image_height;
    if (image_w == -233)
        image_w = bottom_blobs[1].w;
    if (image_h == -233)
        image_h = bottom_blobs[1].h;

    float step_w = step_width;
    float step_h = step_height;
    if (step_w == -233)
        step_w = (float)image_w / w;
    if (step_h == -233)
        step_h = (float)image_h / h;

    int num_min_size = min_sizes.w;
    int num_max_size = max_sizes.w;
    int num_aspect_ratio = aspect_ratios.w;

    int num_prior = num_min_size * num_aspect_ratio + num_min_size + num_max_size;
    if (flip)
        num_prior += num_min_size * num_aspect_ratio;

    Mat& top_blob = top_blobs[0];
    top_blob.create(4 * w * h * num_prior, 2, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < h; i++)
    {
        float* box = (float*)top_blob + i * w * num_prior * 4;

        float center_x = offset * step_w;
        float center_y = offset * step_h + i * step_h;

        for (int j = 0; j < w; j++)
        {
            float box_w;
            float box_h;

            for (int k = 0; k < num_min_size; k++)
            {
                float min_size = min_sizes[k];

                // min size box
                box_w = box_h = min_size;

                box[0] = (center_x - box_w * 0.5f) / image_w;
                box[1] = (center_y - box_h * 0.5f) / image_h;
                box[2] = (center_x + box_w * 0.5f) / image_w;
                box[3] = (center_y + box_h * 0.5f) / image_h;

                box += 4;

                if (num_max_size > 0)
                {
                    float max_size = max_sizes[k];

                    // max size box
                    box_w = box_h = sqrt(min_size * max_size);

                    box[0] = (center_x - box_w * 0.5f) / image_w;
                    box[1] = (center_y - box_h * 0.5f) / image_h;
                    box[2] = (center_x + box_w * 0.5f) / image_w;
                    box[3] = (center_y + box_h * 0.5f) / image_h;

                    box += 4;
                }

                // all aspect_ratios
                for (int p = 0; p < num_aspect_ratio; p++)
                {
                    float ar = aspect_ratios[p];

                    box_w = min_size * sqrt(ar);
                    box_h = min_size / sqrt(ar);

                    box[0] = (center_x - box_w * 0.5f) / image_w;
                    box[1] = (center_y - box_h * 0.5f) / image_h;
                    box[2] = (center_x + box_w * 0.5f) / image_w;
                    box[3] = (center_y + box_h * 0.5f) / image_h;

                    box += 4;

                    if (flip)
                    {
                        box[0] = (center_x - box_h * 0.5f) / image_w;
                        box[1] = (center_y - box_w * 0.5f) / image_h;
                        box[2] = (center_x + box_h * 0.5f) / image_w;
                        box[3] = (center_y + box_w * 0.5f) / image_h;

                        box += 4;
                    }
                }
            }

            center_x += step_w;
        }
    }

    if (clip)
    {
        float* box = top_blob;
        for (int i = 0; i < top_blob.w; i++)
        {
            box[i] = std::min(std::max(box[i], 0.f), 1.f);
        }
    }

    // set variance
    float* var = top_blob.row(1);
    for (int i = 0; i < top_blob.w / 4; i++)
    {
        var[0] = variances[0];
        var[1] = variances[1];
        var[2] = variances[2];
        var[3] = variances[3];

        var += 4;
    }

    return 0;
}